

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.hpp
# Opt level: O0

shared_lock_handle<int,_std::shared_timed_mutex> * __thiscall
gmlc::libguarded::
try_lock_shared_handle_until<int,std::shared_timed_mutex,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
          (shared_lock_handle<int,_std::shared_timed_mutex> *__return_storage_ptr__,libguarded *this
          ,int *obj,shared_timed_mutex *smutex,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  bool bVar1;
  shared_lock<std::shared_timed_mutex> local_68;
  undefined4 local_58;
  shared_lock<std::shared_timed_mutex> local_48;
  undefined1 local_38 [8];
  lock_type slock;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *tp_local;
  shared_timed_mutex *smutex_local;
  int *obj_local;
  
  slock._8_8_ = smutex;
  std::shared_lock<std::shared_timed_mutex>::
  shared_lock<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            ((shared_lock<std::shared_timed_mutex> *)local_38,(mutex_type *)obj,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)smutex);
  bVar1 = std::shared_lock<std::shared_timed_mutex>::owns_lock
                    ((shared_lock<std::shared_timed_mutex> *)local_38);
  if (bVar1) {
    std::shared_lock<std::shared_timed_mutex>::shared_lock
              (&local_48,(shared_lock<std::shared_timed_mutex> *)local_38);
    shared_lock_handle<int,_std::shared_timed_mutex>::shared_lock_handle
              (__return_storage_ptr__,(pointer)this,&local_48);
    std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_48);
  }
  else {
    std::shared_lock<std::shared_timed_mutex>::shared_lock
              (&local_68,(shared_lock<std::shared_timed_mutex> *)local_38);
    shared_lock_handle<int,_std::shared_timed_mutex>::shared_lock_handle
              (__return_storage_ptr__,(pointer)0x0,&local_68);
    std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_68);
  }
  local_58 = 1;
  std::shared_lock<std::shared_timed_mutex>::~shared_lock
            ((shared_lock<std::shared_timed_mutex> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

shared_lock_handle<T, M>
    try_lock_shared_handle_until(const T* obj, M& smutex, const TimePoint& tp)
{
    typename shared_lock_handle<T, M>::lock_type slock(smutex, tp);
    if (slock.owns_lock()) {
        return shared_lock_handle<T, M>(obj, std::move(slock));
    } else {
        return shared_lock_handle<T, M>(nullptr, std::move(slock));
    }
}